

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O0

void __thiscall
helics::MessageFederateManager::MessageFederateManager
          (MessageFederateManager *this,Core *coreOb,MessageFederate *fed,LocalFederateId fedid,
          bool singleThreaded)

{
  TimeRepresentation<count_time<9,_long>_> TVar1;
  undefined4 in_ECX;
  size_t in_RDX;
  undefined8 in_RSI;
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_RDI;
  undefined8 in_stack_ffffffffffffffa8;
  bool enableLocking;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::shared_guarded_opt(in_RDI,SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x38,0));
  gmlc::libguarded::
  atomic_guarded<std::function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::mutex>
  ::atomic_guarded<>((atomic_guarded<std::function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::mutex>
                      *)in_RDI);
  TVar1 = TimeRepresentation<count_time<9,_long>_>::minVal();
  in_RDI[1].m_obj.lookup1._M_h._M_element_count = TVar1.internalTimeCode;
  *(undefined8 *)&in_RDI[1].m_obj.lookup1._M_h._M_rehash_policy = in_RSI;
  in_RDI[1].m_obj.lookup1._M_h._M_rehash_policy._M_next_resize = in_RDX;
  *(undefined4 *)&in_RDI[1].m_obj.lookup1._M_h._M_single_bucket = in_ECX;
  enableLocking = SUB81((ulong)&in_RDI[1].m_obj.names >> 0x38,0);
  gmlc::libguarded::
  shared_guarded_opt<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  ::shared_guarded_opt
            ((shared_guarded_opt<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
              *)in_RDI,enableLocking);
  gmlc::libguarded::
  guarded_opt<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex>::guarded_opt
            ((guarded_opt<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex> *)
             in_RDI,enableLocking);
  return;
}

Assistant:

MessageFederateManager::MessageFederateManager(Core* coreOb,
                                               MessageFederate* fed,
                                               LocalFederateId fedid,
                                               bool singleThreaded):
    mLocalEndpoints(!singleThreaded), coreObject(coreOb), mFed(fed), fedID(fedid),
    eptData(!singleThreaded), messageOrder(!singleThreaded)
{
}